

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O3

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  bool bVar1;
  long lVar2;
  oggpack_buffer *b_00;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lStack_50;
  oggpack_buffer *local_48;
  ulong local_40;
  long local_38;
  
  local_48 = b;
  if (0 < book->used_entries) {
    lVar12 = (long)n;
    lVar5 = book->dim;
    local_38 = lVar12 / lVar5;
    uVar3 = (uint)(lVar12 / lVar5);
    lVar2 = -((long)(int)uVar3 * 8 + 0xfU & 0xfffffffffffffff0);
    if (0 < (int)uVar3) {
      local_40 = (ulong)(uVar3 & 0x7fffffff);
      uVar11 = 0;
      do {
        b_00 = local_48;
        *(undefined8 *)((long)&lStack_50 + lVar2) = 0x1d926b;
        lVar4 = decode_packed_entry_number(book,b_00);
        if (lVar4 == -1) {
          return -1;
        }
        lVar5 = book->dim;
        *(float **)((long)&local_48 + uVar11 * 8 + lVar2) = book->valuelist + lVar4 * lVar5;
        uVar11 = uVar11 + 1;
      } while (local_40 != uVar11);
    }
    if (0 < lVar5) {
      lVar4 = (long)(int)local_38;
      lVar6 = 1;
      lVar7 = 0;
      lVar8 = 0;
      do {
        if (lVar8 < lVar12 && 0 < (int)local_38) {
          lVar9 = 1;
          lVar10 = lVar6;
          do {
            a[lVar10 + -1] =
                 *(float *)(*(long *)((long)&lStack_50 + lVar9 * 8 + lVar2) + lVar7 * 4) +
                 a[lVar10 + -1];
            if (lVar4 <= lVar9) break;
            lVar9 = lVar9 + 1;
            bVar1 = lVar10 < lVar12;
            lVar10 = lVar10 + 1;
          } while (bVar1);
        }
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + lVar4;
        lVar6 = lVar6 + lVar4;
        if (lVar7 == lVar5) {
          return 0;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int step=n/book->dim;
    long *entry = alloca(sizeof(*entry)*step);
    float **t = alloca(sizeof(*t)*step);
    int i,j,o;

    for (i = 0; i < step; i++) {
      entry[i]=decode_packed_entry_number(book,b);
      if(entry[i]==-1)return(-1);
      t[i] = book->valuelist+entry[i]*book->dim;
    }
    for(i=0,o=0;i<book->dim;i++,o+=step)
      for (j=0;o+j<n && j<step;j++)
        a[o+j]+=t[j][i];
  }
  return(0);
}